

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_arithm<unsigned_int>(uint length,uint value1,uint value2,bool allowTrash)

{
  int *piVar1;
  undefined1 (*pauVar2) [16];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int i;
  uint *puVar33;
  undefined8 *puVar34;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var35;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var36;
  int *piVar37;
  undefined1 (*pauVar38) [16];
  ulong uVar39;
  int iVar40;
  long lVar41;
  int *piVar42;
  undefined1 (*pauVar43) [16];
  undefined1 (*pauVar44) [16];
  int *piVar45;
  long lVar46;
  int i_7;
  int iVar47;
  ulong uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint *local_98;
  shared_ptr<unsigned_int> pv1;
  shared_ptr<unsigned_int> pv2;
  shared_ptr<unsigned_int> presult;
  
  puVar33 = nosimd::common::malloc<unsigned_int>(length);
  std::__shared_ptr<unsigned_int,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_int,void(*)(unsigned_int*),void>
            ((__shared_ptr<unsigned_int,(__gnu_cxx::_Lock_policy)2> *)&local_98,puVar33,
             nosimd::common::free<unsigned_int>);
  puVar33 = nosimd::common::malloc<unsigned_int>(length);
  std::__shared_ptr<unsigned_int,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_int,void(*)(unsigned_int*),void>
            ((__shared_ptr<unsigned_int,(__gnu_cxx::_Lock_policy)2> *)
             &pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar33,
             nosimd::common::free<unsigned_int>);
  puVar33 = nosimd::common::malloc<unsigned_int>(length + 1);
  std::__shared_ptr<unsigned_int,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_int,void(*)(unsigned_int*),void>
            ((__shared_ptr<unsigned_int,(__gnu_cxx::_Lock_policy)2> *)
             &pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar33,
             nosimd::common::free<unsigned_int>);
  uVar48 = (ulong)length;
  *(undefined4 *)
   ((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar48 * 4) = 0x7f;
  iVar47 = (int)length >> 2;
  puVar33 = local_98;
  for (iVar40 = iVar47; 3 < iVar40; iVar40 = iVar40 + -4) {
    *puVar33 = value1;
    puVar33[1] = value1;
    puVar33[2] = value1;
    puVar33[3] = value1;
    puVar33[4] = value1;
    puVar33[5] = value1;
    puVar33[6] = value1;
    puVar33[7] = value1;
    puVar33[8] = value1;
    puVar33[9] = value1;
    puVar33[10] = value1;
    puVar33[0xb] = value1;
    puVar33[0xc] = value1;
    puVar33[0xd] = value1;
    puVar33[0xe] = value1;
    puVar33[0xf] = value1;
    puVar33 = puVar33 + 0x10;
  }
  if (1 < iVar40) {
    *puVar33 = value1;
    puVar33[1] = value1;
    puVar33[2] = value1;
    puVar33[3] = value1;
    puVar33[4] = value1;
    puVar33[5] = value1;
    puVar33[6] = value1;
    puVar33[7] = value1;
    iVar40 = iVar40 + -2;
    puVar33 = puVar33 + 8;
  }
  if (iVar40 != 0) {
    *puVar33 = value1;
    puVar33[1] = value1;
    puVar33[2] = value1;
    puVar33[3] = value1;
  }
  lVar46 = (long)(int)length;
  presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)(int)(length & 0xfffffffc);
  for (p_Var35 = presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      _Var36 = pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
      iVar40 = iVar47, (long)p_Var35 < lVar46;
      p_Var35 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var35->_vptr__Sp_counted_base + 1)) {
    local_98[(long)p_Var35] = value1;
  }
  for (; 3 < iVar40; iVar40 = iVar40 + -4) {
    *(uint *)&(_Var36._M_pi)->_vptr__Sp_counted_base = value2;
    *(uint *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = value2;
    (_Var36._M_pi)->_M_use_count = value2;
    (_Var36._M_pi)->_M_weak_count = value2;
    *(uint *)&_Var36._M_pi[1]._vptr__Sp_counted_base = value2;
    *(uint *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = value2;
    _Var36._M_pi[1]._M_use_count = value2;
    _Var36._M_pi[1]._M_weak_count = value2;
    *(uint *)&_Var36._M_pi[2]._vptr__Sp_counted_base = value2;
    *(uint *)((long)&_Var36._M_pi[2]._vptr__Sp_counted_base + 4) = value2;
    _Var36._M_pi[2]._M_use_count = value2;
    _Var36._M_pi[2]._M_weak_count = value2;
    *(uint *)&_Var36._M_pi[3]._vptr__Sp_counted_base = value2;
    *(uint *)((long)&_Var36._M_pi[3]._vptr__Sp_counted_base + 4) = value2;
    _Var36._M_pi[3]._M_use_count = value2;
    _Var36._M_pi[3]._M_weak_count = value2;
    _Var36._M_pi = _Var36._M_pi + 4;
  }
  if (1 < iVar40) {
    *(uint *)&(_Var36._M_pi)->_vptr__Sp_counted_base = value2;
    *(uint *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = value2;
    (_Var36._M_pi)->_M_use_count = value2;
    (_Var36._M_pi)->_M_weak_count = value2;
    *(uint *)&_Var36._M_pi[1]._vptr__Sp_counted_base = value2;
    *(uint *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = value2;
    _Var36._M_pi[1]._M_use_count = value2;
    _Var36._M_pi[1]._M_weak_count = value2;
    iVar40 = iVar40 + -2;
    _Var36._M_pi = _Var36._M_pi + 2;
  }
  p_Var35 = presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (iVar40 != 0) {
    *(uint *)&(_Var36._M_pi)->_vptr__Sp_counted_base = value2;
    *(uint *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = value2;
    (_Var36._M_pi)->_M_use_count = value2;
    (_Var36._M_pi)->_M_weak_count = value2;
  }
  for (; (long)p_Var35 < lVar46;
      p_Var35 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var35->_vptr__Sp_counted_base + 1)) {
    *(uint *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_vptr__Sp_counted_base + (long)p_Var35 * 4) = value2;
  }
  uVar39 = 0;
  while (uVar48 != uVar39) {
    if ((local_98[uVar39] != value1) ||
       (lVar41 = uVar39 * 4, uVar39 = uVar39 + 1,
       *(uint *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41) != value2)) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar34 + 1) = 0x1a;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (iVar40 = iVar47; 3 < iVar40; iVar40 = iVar40 + -4) {
    piVar45 = (int *)((long)local_98 + lVar41);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)local_98 + lVar41 + 0x10);
    iVar6 = *piVar37;
    iVar7 = piVar37[1];
    iVar8 = piVar37[2];
    iVar9 = piVar37[3];
    piVar37 = (int *)((long)local_98 + lVar41 + 0x20);
    iVar10 = *piVar37;
    iVar11 = piVar37[1];
    iVar12 = piVar37[2];
    iVar13 = piVar37[3];
    piVar37 = (int *)((long)local_98 + lVar41 + 0x30);
    iVar14 = *piVar37;
    iVar15 = piVar37[1];
    iVar16 = piVar37[2];
    iVar17 = piVar37[3];
    piVar37 = (int *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
    iVar18 = piVar37[1];
    iVar19 = piVar37[2];
    iVar20 = piVar37[3];
    piVar42 = (int *)((long)&pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar41);
    iVar21 = *piVar42;
    iVar22 = piVar42[1];
    iVar23 = piVar42[2];
    iVar24 = piVar42[3];
    piVar42 = (int *)((long)&pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar41);
    iVar25 = *piVar42;
    iVar26 = piVar42[1];
    iVar27 = piVar42[2];
    iVar28 = piVar42[3];
    piVar42 = (int *)((long)&pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar41);
    iVar29 = *piVar42;
    iVar30 = piVar42[1];
    iVar31 = piVar42[2];
    iVar32 = piVar42[3];
    piVar42 = (int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
    *piVar42 = *piVar37 + *piVar45;
    piVar42[1] = iVar18 + iVar3;
    piVar42[2] = iVar19 + iVar4;
    piVar42[3] = iVar20 + iVar5;
    piVar45 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar41);
    *piVar45 = iVar21 + iVar6;
    piVar45[1] = iVar22 + iVar7;
    piVar45[2] = iVar23 + iVar8;
    piVar45[3] = iVar24 + iVar9;
    piVar45 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar41);
    *piVar45 = iVar25 + iVar10;
    piVar45[1] = iVar26 + iVar11;
    piVar45[2] = iVar27 + iVar12;
    piVar45[3] = iVar28 + iVar13;
    piVar45 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar41);
    *piVar45 = iVar29 + iVar14;
    piVar45[1] = iVar30 + iVar15;
    piVar45[2] = iVar31 + iVar16;
    piVar45[3] = iVar32 + iVar17;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar40 < 2) {
    piVar45 = (int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
    piVar37 = (int *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
    piVar42 = (int *)(lVar41 + (long)local_98);
  }
  else {
    piVar1 = (int *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
    piVar37 = piVar1 + 8;
    piVar45 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar41);
    piVar42 = (int *)((long)local_98 + lVar41 + 0x20);
    iVar3 = piVar42[-7];
    iVar4 = piVar42[-6];
    iVar5 = piVar42[-5];
    iVar6 = piVar1[1];
    iVar7 = piVar1[2];
    iVar8 = piVar1[3];
    piVar45[-8] = *piVar1 + piVar42[-8];
    piVar45[-7] = iVar6 + iVar3;
    piVar45[-6] = iVar7 + iVar4;
    piVar45[-5] = iVar8 + iVar5;
    iVar3 = piVar42[-3];
    iVar4 = piVar42[-2];
    iVar5 = piVar42[-1];
    iVar6 = piVar1[5];
    iVar7 = piVar1[6];
    iVar8 = piVar1[7];
    piVar45[-4] = piVar1[4] + piVar42[-4];
    piVar45[-3] = iVar6 + iVar3;
    piVar45[-2] = iVar7 + iVar4;
    piVar45[-1] = iVar8 + iVar5;
    iVar40 = iVar40 + -2;
  }
  if (iVar40 != 0) {
    iVar40 = piVar42[1];
    iVar3 = piVar42[2];
    iVar4 = piVar42[3];
    iVar5 = piVar37[1];
    iVar6 = piVar37[2];
    iVar7 = piVar37[3];
    *piVar45 = *piVar37 + *piVar42;
    piVar45[1] = iVar5 + iVar40;
    piVar45[2] = iVar6 + iVar3;
    piVar45[3] = iVar7 + iVar4;
  }
  for (p_Var35 = presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi; (long)p_Var35 < lVar46;
      p_Var35 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var35->_vptr__Sp_counted_base + 1)) {
    *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_vptr__Sp_counted_base + (long)p_Var35 * 4) =
         *(int *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var35 * 4) +
         local_98[(long)p_Var35];
  }
  uVar39 = 0;
  while (uVar48 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41) != value2 + value1) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar34 + 1) = 0x22;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (iVar40 = iVar47; 3 < iVar40; iVar40 = iVar40 + -4) {
    piVar45 = (int *)((long)local_98 + lVar41);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)local_98 + lVar41 + 0x10);
    iVar6 = *piVar37;
    iVar7 = piVar37[1];
    iVar8 = piVar37[2];
    iVar9 = piVar37[3];
    piVar37 = (int *)((long)local_98 + lVar41 + 0x20);
    iVar10 = *piVar37;
    iVar11 = piVar37[1];
    iVar12 = piVar37[2];
    iVar13 = piVar37[3];
    piVar37 = (int *)((long)local_98 + lVar41 + 0x30);
    iVar14 = *piVar37;
    iVar15 = piVar37[1];
    iVar16 = piVar37[2];
    iVar17 = piVar37[3];
    piVar37 = (int *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
    iVar18 = piVar37[1];
    iVar19 = piVar37[2];
    iVar20 = piVar37[3];
    piVar42 = (int *)((long)&pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar41);
    iVar21 = *piVar42;
    iVar22 = piVar42[1];
    iVar23 = piVar42[2];
    iVar24 = piVar42[3];
    piVar42 = (int *)((long)&pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar41);
    iVar25 = *piVar42;
    iVar26 = piVar42[1];
    iVar27 = piVar42[2];
    iVar28 = piVar42[3];
    piVar42 = (int *)((long)&pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar41);
    iVar29 = *piVar42;
    iVar30 = piVar42[1];
    iVar31 = piVar42[2];
    iVar32 = piVar42[3];
    piVar42 = (int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
    *piVar42 = *piVar45 - *piVar37;
    piVar42[1] = iVar3 - iVar18;
    piVar42[2] = iVar4 - iVar19;
    piVar42[3] = iVar5 - iVar20;
    piVar45 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar41);
    *piVar45 = iVar6 - iVar21;
    piVar45[1] = iVar7 - iVar22;
    piVar45[2] = iVar8 - iVar23;
    piVar45[3] = iVar9 - iVar24;
    piVar45 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar41);
    *piVar45 = iVar10 - iVar25;
    piVar45[1] = iVar11 - iVar26;
    piVar45[2] = iVar12 - iVar27;
    piVar45[3] = iVar13 - iVar28;
    piVar45 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar41);
    *piVar45 = iVar14 - iVar29;
    piVar45[1] = iVar15 - iVar30;
    piVar45[2] = iVar16 - iVar31;
    piVar45[3] = iVar17 - iVar32;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar40 < 2) {
    piVar45 = (int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
    piVar37 = (int *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
    piVar42 = (int *)(lVar41 + (long)local_98);
  }
  else {
    piVar1 = (int *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
    piVar37 = piVar1 + 8;
    piVar45 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar41);
    piVar42 = (int *)((long)local_98 + lVar41 + 0x20);
    iVar3 = piVar42[-7];
    iVar4 = piVar42[-6];
    iVar5 = piVar42[-5];
    iVar6 = piVar1[1];
    iVar7 = piVar1[2];
    iVar8 = piVar1[3];
    piVar45[-8] = piVar42[-8] - *piVar1;
    piVar45[-7] = iVar3 - iVar6;
    piVar45[-6] = iVar4 - iVar7;
    piVar45[-5] = iVar5 - iVar8;
    iVar3 = piVar42[-3];
    iVar4 = piVar42[-2];
    iVar5 = piVar42[-1];
    iVar6 = piVar1[5];
    iVar7 = piVar1[6];
    iVar8 = piVar1[7];
    piVar45[-4] = piVar42[-4] - piVar1[4];
    piVar45[-3] = iVar3 - iVar6;
    piVar45[-2] = iVar4 - iVar7;
    piVar45[-1] = iVar5 - iVar8;
    iVar40 = iVar40 + -2;
  }
  if (iVar40 != 0) {
    iVar40 = piVar42[1];
    iVar3 = piVar42[2];
    iVar4 = piVar42[3];
    iVar5 = piVar37[1];
    iVar6 = piVar37[2];
    iVar7 = piVar37[3];
    *piVar45 = *piVar42 - *piVar37;
    piVar45[1] = iVar40 - iVar5;
    piVar45[2] = iVar3 - iVar6;
    piVar45[3] = iVar4 - iVar7;
  }
  for (p_Var35 = presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi; (long)p_Var35 < lVar46;
      p_Var35 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var35->_vptr__Sp_counted_base + 1)) {
    *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_vptr__Sp_counted_base + (long)p_Var35 * 4) =
         local_98[(long)p_Var35] -
         *(int *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var35 * 4);
  }
  uVar39 = 0;
  while (uVar48 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41) != value1 - value2) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar34 + 1) = 0x2a;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (iVar40 = iVar47; 3 < iVar40; iVar40 = iVar40 + -4) {
    auVar52 = pmulld(*(undefined1 (*) [16])
                      ((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41),
                     *(undefined1 (*) [16])((long)local_98 + lVar41));
    auVar49 = pmulld(*(undefined1 (*) [16])
                      ((long)&pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar41),
                     *(undefined1 (*) [16])((long)local_98 + lVar41 + 0x10));
    auVar50 = pmulld(*(undefined1 (*) [16])
                      ((long)&pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar41),
                     *(undefined1 (*) [16])((long)local_98 + lVar41 + 0x20));
    auVar51 = pmulld(*(undefined1 (*) [16])
                      ((long)&pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar41),
                     *(undefined1 (*) [16])((long)local_98 + lVar41 + 0x30));
    *(undefined1 (*) [16])
     ((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _vptr__Sp_counted_base + lVar41) = auVar52;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
             _vptr__Sp_counted_base + lVar41) = auVar49;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
             _vptr__Sp_counted_base + lVar41) = auVar50;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
             _vptr__Sp_counted_base + lVar41) = auVar51;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar40 < 2) {
    pauVar44 = (undefined1 (*) [16])
               ((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_vptr__Sp_counted_base + lVar41);
    pauVar38 = (undefined1 (*) [16])
               ((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_vptr__Sp_counted_base + lVar41);
    pauVar43 = (undefined1 (*) [16])(lVar41 + (long)local_98);
  }
  else {
    pauVar2 = (undefined1 (*) [16])
              ((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)->_vptr__Sp_counted_base + lVar41);
    pauVar38 = pauVar2 + 2;
    pauVar44 = (undefined1 (*) [16])
               ((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi[2]._vptr__Sp_counted_base + lVar41);
    pauVar43 = (undefined1 (*) [16])((long)local_98 + lVar41 + 0x20);
    auVar49 = pmulld(*pauVar2,pauVar43[-2]);
    pauVar44[-2] = auVar49;
    auVar49 = pmulld(pauVar2[1],pauVar43[-1]);
    pauVar44[-1] = auVar49;
    iVar40 = iVar40 + -2;
  }
  if (iVar40 != 0) {
    auVar49 = pmulld(*pauVar38,*pauVar43);
    *pauVar44 = auVar49;
  }
  for (p_Var35 = presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi; (long)p_Var35 < lVar46;
      p_Var35 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var35->_vptr__Sp_counted_base + 1)) {
    *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_vptr__Sp_counted_base + (long)p_Var35 * 4) =
         *(int *)((long)&(pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var35 * 4) *
         local_98[(long)p_Var35];
  }
  uVar39 = 0;
  while (uVar48 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41) != value2 * value1) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar34 + 1) = 0x32;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::div<unsigned_int>
            (local_98,(uint *)pv1.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,
             (uint *)pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi,length);
  auVar49._4_4_ = value2;
  auVar49._0_4_ = value2;
  auVar49._8_4_ = value2;
  auVar49._12_4_ = value2;
  uVar39 = 0;
  while (uVar48 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41) != value1 / value2) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar34 + 1) = 0x3a;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (iVar40 = iVar47; 3 < iVar40; iVar40 = iVar40 + -4) {
    piVar45 = (int *)((long)local_98 + lVar41);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar45 + value2;
    piVar37[1] = iVar3 + value2;
    piVar37[2] = iVar4 + value2;
    piVar37[3] = iVar5 + value2;
    piVar45 = (int *)((long)local_98 + lVar41 + 0x10);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar45 + value2;
    piVar37[1] = iVar3 + value2;
    piVar37[2] = iVar4 + value2;
    piVar37[3] = iVar5 + value2;
    piVar45 = (int *)((long)local_98 + lVar41 + 0x20);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar45 + value2;
    piVar37[1] = iVar3 + value2;
    piVar37[2] = iVar4 + value2;
    piVar37[3] = iVar5 + value2;
    piVar45 = (int *)((long)local_98 + lVar41 + 0x30);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar45 + value2;
    piVar37[1] = iVar3 + value2;
    piVar37[2] = iVar4 + value2;
    piVar37[3] = iVar5 + value2;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar40 < 2) {
    piVar45 = (int *)((long)local_98 + lVar41);
    piVar37 = (int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
  }
  else {
    piVar42 = (int *)((long)local_98 + lVar41);
    piVar45 = piVar42 + 8;
    iVar3 = piVar42[1];
    iVar4 = piVar42[2];
    iVar5 = piVar42[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar41);
    piVar37[-8] = *piVar42 + value2;
    piVar37[-7] = iVar3 + value2;
    piVar37[-6] = iVar4 + value2;
    piVar37[-5] = iVar5 + value2;
    iVar3 = piVar42[5];
    iVar4 = piVar42[6];
    iVar5 = piVar42[7];
    piVar37[-4] = piVar42[4] + value2;
    piVar37[-3] = iVar3 + value2;
    piVar37[-2] = iVar4 + value2;
    piVar37[-1] = iVar5 + value2;
    iVar40 = iVar40 + -2;
  }
  _Var36._M_pi = presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
  if (iVar40 != 0) {
    iVar40 = piVar45[1];
    iVar3 = piVar45[2];
    iVar4 = piVar45[3];
    *piVar37 = *piVar45 + value2;
    piVar37[1] = iVar40 + value2;
    piVar37[2] = iVar3 + value2;
    piVar37[3] = iVar4 + value2;
  }
  for (; (long)_Var36._M_pi < lVar46;
      _Var36._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 1)) {
    *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_vptr__Sp_counted_base + (long)_Var36._M_pi * 4) =
         local_98[(long)_Var36._M_pi] + value2;
  }
  uVar39 = 0;
  while (uVar48 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41) != value2 + value1) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar34 + 1) = 0x43;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (iVar40 = iVar47; 3 < iVar40; iVar40 = iVar40 + -4) {
    piVar45 = (int *)((long)local_98 + lVar41);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar45 - value2;
    piVar37[1] = iVar3 - value2;
    piVar37[2] = iVar4 - value2;
    piVar37[3] = iVar5 - value2;
    piVar45 = (int *)((long)local_98 + lVar41 + 0x10);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar45 - value2;
    piVar37[1] = iVar3 - value2;
    piVar37[2] = iVar4 - value2;
    piVar37[3] = iVar5 - value2;
    piVar45 = (int *)((long)local_98 + lVar41 + 0x20);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar45 - value2;
    piVar37[1] = iVar3 - value2;
    piVar37[2] = iVar4 - value2;
    piVar37[3] = iVar5 - value2;
    piVar45 = (int *)((long)local_98 + lVar41 + 0x30);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar41);
    *piVar37 = *piVar45 - value2;
    piVar37[1] = iVar3 - value2;
    piVar37[2] = iVar4 - value2;
    piVar37[3] = iVar5 - value2;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar40 < 2) {
    piVar45 = (int *)((long)local_98 + lVar41);
    piVar37 = (int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
  }
  else {
    piVar42 = (int *)((long)local_98 + lVar41);
    piVar45 = piVar42 + 8;
    iVar3 = piVar42[1];
    iVar4 = piVar42[2];
    iVar5 = piVar42[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar41);
    piVar37[-8] = *piVar42 - value2;
    piVar37[-7] = iVar3 - value2;
    piVar37[-6] = iVar4 - value2;
    piVar37[-5] = iVar5 - value2;
    iVar3 = piVar42[5];
    iVar4 = piVar42[6];
    iVar5 = piVar42[7];
    piVar37[-4] = piVar42[4] - value2;
    piVar37[-3] = iVar3 - value2;
    piVar37[-2] = iVar4 - value2;
    piVar37[-1] = iVar5 - value2;
    iVar40 = iVar40 + -2;
  }
  _Var36._M_pi = presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
  if (iVar40 != 0) {
    iVar40 = piVar45[1];
    iVar3 = piVar45[2];
    iVar4 = piVar45[3];
    *piVar37 = *piVar45 - value2;
    piVar37[1] = iVar40 - value2;
    piVar37[2] = iVar3 - value2;
    piVar37[3] = iVar4 - value2;
  }
  for (; (long)_Var36._M_pi < lVar46;
      _Var36._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 1)) {
    *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_vptr__Sp_counted_base + (long)_Var36._M_pi * 4) =
         local_98[(long)_Var36._M_pi] - value2;
  }
  uVar39 = 0;
  while (uVar48 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41) != value1 - value2) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar34 + 1) = 0x4b;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (iVar40 = iVar47; 3 < iVar40; iVar40 = iVar40 + -4) {
    piVar45 = (int *)((long)local_98 + lVar41);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
    *piVar37 = value2 - *piVar45;
    piVar37[1] = value2 - iVar3;
    piVar37[2] = value2 - iVar4;
    piVar37[3] = value2 - iVar5;
    piVar45 = (int *)((long)local_98 + lVar41 + 0x10);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[1]._vptr__Sp_counted_base + lVar41);
    *piVar37 = value2 - *piVar45;
    piVar37[1] = value2 - iVar3;
    piVar37[2] = value2 - iVar4;
    piVar37[3] = value2 - iVar5;
    piVar45 = (int *)((long)local_98 + lVar41 + 0x20);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar41);
    *piVar37 = value2 - *piVar45;
    piVar37[1] = value2 - iVar3;
    piVar37[2] = value2 - iVar4;
    piVar37[3] = value2 - iVar5;
    piVar45 = (int *)((long)local_98 + lVar41 + 0x30);
    iVar3 = piVar45[1];
    iVar4 = piVar45[2];
    iVar5 = piVar45[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[3]._vptr__Sp_counted_base + lVar41);
    *piVar37 = value2 - *piVar45;
    piVar37[1] = value2 - iVar3;
    piVar37[2] = value2 - iVar4;
    piVar37[3] = value2 - iVar5;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar40 < 2) {
    piVar45 = (int *)((long)local_98 + lVar41);
    piVar37 = (int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41);
  }
  else {
    piVar42 = (int *)((long)local_98 + lVar41);
    piVar45 = piVar42 + 8;
    iVar3 = piVar42[1];
    iVar4 = piVar42[2];
    iVar5 = piVar42[3];
    piVar37 = (int *)((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[2]._vptr__Sp_counted_base + lVar41);
    piVar37[-8] = value2 - *piVar42;
    piVar37[-7] = value2 - iVar3;
    piVar37[-6] = value2 - iVar4;
    piVar37[-5] = value2 - iVar5;
    iVar3 = piVar42[5];
    iVar4 = piVar42[6];
    iVar5 = piVar42[7];
    piVar37[-4] = value2 - piVar42[4];
    piVar37[-3] = value2 - iVar3;
    piVar37[-2] = value2 - iVar4;
    piVar37[-1] = value2 - iVar5;
    iVar40 = iVar40 + -2;
  }
  if (iVar40 != 0) {
    iVar40 = piVar45[1];
    iVar3 = piVar45[2];
    iVar4 = piVar45[3];
    *piVar37 = value2 - *piVar45;
    piVar37[1] = value2 - iVar40;
    piVar37[2] = value2 - iVar3;
    piVar37[3] = value2 - iVar4;
  }
  for (_Var36._M_pi = presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi; (long)_Var36._M_pi < lVar46;
      _Var36._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 1)) {
    *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_vptr__Sp_counted_base + (long)_Var36._M_pi * 4) =
         value2 - local_98[(long)_Var36._M_pi];
  }
  uVar39 = 0;
  while (uVar48 != uVar39) {
    lVar41 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar41) != value2 - value1) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar34 + 1) = 0x53;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  lVar41 = 0;
  for (; 3 < iVar47; iVar47 = iVar47 + -4) {
    auVar50 = pmulld(*(undefined1 (*) [16])((long)local_98 + lVar41),auVar49);
    *(undefined1 (*) [16])
     ((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _vptr__Sp_counted_base + lVar41) = auVar50;
    auVar50 = pmulld(*(undefined1 (*) [16])((long)local_98 + lVar41 + 0x10),auVar49);
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
             _vptr__Sp_counted_base + lVar41) = auVar50;
    auVar50 = pmulld(*(undefined1 (*) [16])((long)local_98 + lVar41 + 0x20),auVar49);
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
             _vptr__Sp_counted_base + lVar41) = auVar50;
    auVar50 = pmulld(*(undefined1 (*) [16])((long)local_98 + lVar41 + 0x30),auVar49);
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
             _vptr__Sp_counted_base + lVar41) = auVar50;
    lVar41 = lVar41 + 0x40;
  }
  if (iVar47 < 2) {
    pauVar44 = (undefined1 (*) [16])((long)local_98 + lVar41);
    pauVar38 = (undefined1 (*) [16])
               ((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_vptr__Sp_counted_base + lVar41);
  }
  else {
    pauVar43 = (undefined1 (*) [16])((long)local_98 + lVar41);
    pauVar44 = pauVar43 + 2;
    auVar50 = pmulld(*pauVar43,auVar49);
    pauVar38 = (undefined1 (*) [16])
               ((long)&pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi[2]._vptr__Sp_counted_base + lVar41);
    pauVar38[-2] = auVar50;
    auVar50 = pmulld(pauVar43[1],auVar49);
    pauVar38[-1] = auVar50;
    iVar47 = iVar47 + -2;
  }
  _Var36._M_pi = presult.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
  if (iVar47 != 0) {
    auVar49 = pmulld(*pauVar44,auVar49);
    *pauVar38 = auVar49;
  }
  for (; (long)_Var36._M_pi < lVar46;
      _Var36._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 1)) {
    *(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_vptr__Sp_counted_base + (long)_Var36._M_pi * 4) =
         local_98[(long)_Var36._M_pi] * value2;
  }
  uVar39 = 0;
  while (uVar48 != uVar39) {
    lVar46 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar46) != value2 * value1) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar34 + 1) = 0x5b;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divC<unsigned_int>
            (local_98,value2,
             (uint *)pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi,length);
  uVar39 = 0;
  while (uVar48 != uVar39) {
    lVar46 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar46) != value1 / value2) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar34 + 1) = 99;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divCRev<unsigned_int>
            (local_98,value2,
             (uint *)pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi,length);
  uVar39 = 0;
  while (uVar48 != uVar39) {
    lVar46 = uVar39 * 4;
    uVar39 = uVar39 + 1;
    if (*(uint *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar46) != value2 / value1) {
      puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
      *(undefined4 *)(puVar34 + 1) = 0x6b;
      *(uint *)((long)puVar34 + 0xc) = length;
      __cxa_throw(puVar34,&Exception::typeinfo,0);
    }
  }
  if ((!allowTrash) &&
     (*(int *)((long)&(pv2.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)->_vptr__Sp_counted_base + uVar48 * 4) != 0x7f)) {
    puVar34 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar34 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned int]";
    *(undefined4 *)(puVar34 + 1) = 0x70;
    *(uint *)((long)puVar34 + 0xc) = length;
    __cxa_throw(puVar34,&Exception::typeinfo,0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}